

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExtractSHRT.cpp
# Opt level: O0

void anon_unknown.dwarf_39f02::testMatrix(M33f *M)

{
  bool bVar1;
  ostream *poVar2;
  float *pfVar3;
  void *pvVar4;
  Matrix33<float> *in_RDI;
  Matrix33<float> *this;
  float extraout_XMM0_Da;
  int k;
  int j;
  M33f D;
  M33f N;
  float r;
  float h;
  V2f t;
  V2f s;
  Vec2<float> *in_stack_fffffffffffffee8;
  Matrix33<float> *in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff00;
  int iVar5;
  undefined4 in_stack_ffffffffffffff04;
  int i;
  Vec2<float> *in_stack_ffffffffffffff08;
  float *in_stack_ffffffffffffff10;
  Matrix33<float> *in_stack_ffffffffffffff18;
  Vec2<float> *in_stack_ffffffffffffff20;
  Matrix33<float> *in_stack_ffffffffffffff28;
  Matrix33<float> local_8c;
  Matrix33<float> *in_stack_ffffffffffffffa8;
  ostream *in_stack_ffffffffffffffb0;
  float local_1c;
  Vec2<float> local_18;
  Vec2<float> local_10 [2];
  
  Imath_2_5::Vec2<float>::Vec2(local_10,0.0);
  Imath_2_5::Vec2<float>::Vec2(&local_18,0.0);
  bVar1 = Imath_2_5::extractSHRT<float>
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                     (float *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff08,SUB41((uint)in_stack_ffffffffffffff04 >> 0x18,0));
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Unable to extractSHRT");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testExtractSHRT.cpp"
                  ,0x4f,"void (anonymous namespace)::testMatrix(const M33f)");
  }
  Imath_2_5::Matrix33<float>::Matrix33(in_stack_fffffffffffffef0);
  Imath_2_5::Matrix33<float>::Matrix33(in_stack_fffffffffffffef0);
  Imath_2_5::Matrix33<float>::setScale<float>(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  Imath_2_5::Matrix33<float>::operator*=
            ((Matrix33<float> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  Imath_2_5::Matrix33<float>::Matrix33(in_stack_fffffffffffffef0);
  Imath_2_5::Matrix33<float>::setShear<float>(&local_8c,&local_1c);
  Imath_2_5::Matrix33<float>::operator*=
            ((Matrix33<float> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  Imath_2_5::Matrix33<float>::Matrix33(in_stack_fffffffffffffef0);
  Imath_2_5::Matrix33<float>::setRotation<float>
            ((Matrix33<float> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (float)((ulong)in_RDI >> 0x20));
  Imath_2_5::Matrix33<float>::operator*=
            ((Matrix33<float> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  Imath_2_5::Matrix33<float>::Matrix33(in_stack_fffffffffffffef0);
  Imath_2_5::Matrix33<float>::setTranslation<float>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  Imath_2_5::Matrix33<float>::operator*=
            ((Matrix33<float> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  Imath_2_5::Matrix33<float>::operator-(in_RDI,in_stack_fffffffffffffef0);
  i = 0;
  do {
    if (2 < i) {
      return;
    }
    for (iVar5 = 0; iVar5 < 3; iVar5 = iVar5 + 1) {
      this = (Matrix33<float> *)&stack0xffffffffffffff08;
      Imath_2_5::Matrix33<float>::operator[](this,i);
      std::abs((int)this);
      if (1e-05 < extraout_XMM0_Da) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "unexpectedly large matrix to euler angles conversion error: ");
        pfVar3 = Imath_2_5::Matrix33<float>::operator[]
                           ((Matrix33<float> *)&stack0xffffffffffffff08,i);
        pvVar4 = (void *)std::ostream::operator<<(poVar2,pfVar3[iVar5]);
        std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
        poVar2 = (ostream *)std::ostream::operator<<(&std::cout,i);
        poVar2 = std::operator<<(poVar2," ");
        pvVar4 = (void *)std::ostream::operator<<(poVar2,iVar5);
        std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
        std::operator<<((ostream *)&std::cout,"M\n");
        poVar2 = Imath_2_5::operator<<(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        std::operator<<((ostream *)&std::cout,"N\n");
        poVar2 = Imath_2_5::operator<<(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        std::operator<<((ostream *)&std::cout,"D\n");
        poVar2 = Imath_2_5::operator<<(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testExtractSHRT.cpp"
                      ,0x75,"void (anonymous namespace)::testMatrix(const M33f)");
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void
testMatrix (const M33f M)
{
    //
    // Extract the rotation angle from M, and convert the
    // angle back to a matrix, N.
    //

    V2f s(0.f), t(0.f);
    float h, r= 0.f;
  
    if (!extractSHRT (M, s, h, r, t, true))
    {
        cout << "Unable to extractSHRT" << std::endl;
        assert(false);
    }

    M33f N;

    N *= M33f().setScale (s);
    N *= M33f().setShear (h);
    N *= M33f().setRotation (r);
    N *= M33f().setTranslation (t);

    debug (("Re-scale: %f %f\n", s[0], s[1]));
    debug (("Re-shear: %f\n", h));
    debug (("Re-rot  : %f\n", r));
    debug (("Re-trans: %f %f\n", t[0], t[1]));

    //
    // Verify that the entries in M and N do not
    // differ too much.
    //

    M33f D (M - N);

    for (int j = 0; j < 3; ++j)
    {
	for (int k = 0; k < 3; ++k)
	{
	    if (abs (D[j][k]) > 0.00001)
	    {
		cout << "unexpectedly large matrix to "
			"euler angles conversion error: " <<
			D[j][k] << endl;

		cout << j << " " << k << endl;

		cout << "M\n" << M << endl;
		cout << "N\n" << N << endl;
		cout << "D\n" << D << endl;

		assert (false);
	    }
	}
    }
}